

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void handleDefaultArguments(QList<FunctionDef> *functionList,FunctionDef *function)

{
  long lVar1;
  
  while ((lVar1 = (function->arguments).d.size, lVar1 != 0 &&
         ((function->arguments).d.ptr[lVar1 + -1].isDefault == true))) {
    function->wasCloned = true;
    QList<ArgumentDef>::removeLast(&function->arguments);
    QList<FunctionDef>::emplaceBack<FunctionDef_const&>(functionList,function);
  }
  return;
}

Assistant:

inline void handleDefaultArguments(QList<FunctionDef> *functionList, FunctionDef &function)
{
    // support a function with a default argument by pretending there is an
    // overload without the argument (the original function is the overload with
    // all arguments present)
    while (function.arguments.size() > 0 && function.arguments.constLast().isDefault) {
        function.wasCloned = true;
        function.arguments.removeLast();
        *functionList += function;
    }
}